

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocaltime.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_3f6551::MkTimeResult::MkTimeResult(MkTimeResult *this,tm *prior)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  time_t tVar13;
  bool bVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  bool bVar16;
  tm local_58;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (this->local).tm_zone = prior->tm_zone;
  iVar9 = prior->tm_sec;
  iVar10 = prior->tm_min;
  iVar11 = prior->tm_hour;
  iVar12 = prior->tm_mday;
  iVar1 = prior->tm_mon;
  iVar2 = prior->tm_year;
  iVar3 = prior->tm_wday;
  iVar8 = prior->tm_yday;
  uVar7 = *(undefined4 *)&prior->field_0x24;
  lVar4 = prior->tm_gmtoff;
  (this->local).tm_isdst = prior->tm_isdst;
  *(undefined4 *)&(this->local).field_0x24 = uVar7;
  (this->local).tm_gmtoff = lVar4;
  (this->local).tm_mon = iVar1;
  (this->local).tm_year = iVar2;
  (this->local).tm_wday = iVar3;
  (this->local).tm_yday = iVar8;
  (this->local).tm_sec = iVar9;
  (this->local).tm_min = iVar10;
  (this->local).tm_hour = iVar11;
  (this->local).tm_mday = iVar12;
  tVar13 = qMkTime(&this->local);
  this->utcSecs = tVar13;
  bVar16 = true;
  if (tVar13 == -1) {
    iVar1 = (this->local).tm_year;
    if ((0xfffffffd < iVar1 - 0x47U) &&
       (uVar15 = (((long)(this->local).tm_sec - (this->local).tm_gmtoff) +
                 ((long)(this->local).tm_min + (long)(this->local).tm_hour * 0x3c) * 0x3c) *
                 0x54f43e32d21c10b + 0x57fcf746ebe630b,
       (uVar15 >> 7 | uVar15 << 0x39) < 0xc22e45067289)) {
      iVar2 = (this->local).tm_mday;
      iVar3 = (this->local).tm_mon;
      if (iVar1 == 0x45) {
        bVar16 = iVar3 < 0xb;
        bVar14 = iVar2 < 0x1f;
      }
      else {
        bVar16 = 0 < iVar3;
        bVar14 = 1 < iVar2;
      }
      if (!bVar14 && !bVar16) {
        uVar5 = (this->local).tm_sec;
        uVar6 = (this->local).tm_min;
        local_58.tm_hour = (this->local).tm_hour;
        local_58.tm_mday = (this->local).tm_mday;
        local_58.tm_mon = (this->local).tm_mon;
        local_58.tm_year = (this->local).tm_year;
        local_58.tm_wday = (this->local).tm_wday;
        local_58.tm_yday = (this->local).tm_yday;
        local_58.tm_isdst = (this->local).tm_isdst;
        local_58._36_4_ = *(undefined4 *)&(this->local).field_0x24;
        local_58.tm_gmtoff = (this->local).tm_gmtoff;
        local_58.tm_zone = (this->local).tm_zone;
        local_58.tm_min = uVar6;
        local_58.tm_sec = uVar5 + -1;
        tVar13 = qMkTime(&local_58);
        if (tVar13 == -2) {
          (this->local).tm_sec = local_58.tm_sec;
          (this->local).tm_min = local_58.tm_min;
          (this->local).tm_hour = local_58.tm_hour;
          (this->local).tm_mday = local_58.tm_mday;
          (this->local).tm_zone = local_58.tm_zone;
          (this->local).tm_isdst = local_58.tm_isdst;
          *(undefined4 *)&(this->local).field_0x24 = local_58._36_4_;
          (this->local).tm_gmtoff = local_58.tm_gmtoff;
          (this->local).tm_mon = local_58.tm_mon;
          (this->local).tm_year = local_58.tm_year;
          (this->local).tm_wday = local_58.tm_wday;
          (this->local).tm_yday = local_58.tm_yday;
          (this->local).tm_sec = (this->local).tm_sec + 1;
        }
        bVar16 = tVar13 == -2;
        goto LAB_00128c7a;
      }
    }
    bVar16 = false;
  }
LAB_00128c7a:
  this->good = bVar16;
  if ((((prior->tm_year == (this->local).tm_year) && (prior->tm_mon == (this->local).tm_mon)) &&
      (prior->tm_mday == (this->local).tm_mday)) &&
     (((prior->tm_hour == (this->local).tm_hour && (prior->tm_min == (this->local).tm_min)) &&
      (prior->tm_sec == (this->local).tm_sec)))) {
    iVar1 = (this->local).tm_isdst;
    if (prior->tm_isdst == -1) {
      bVar16 = -1 < iVar1;
    }
    else {
      bVar16 = prior->tm_isdst == iVar1;
    }
  }
  else {
    bVar16 = false;
  }
  this->adjusted = (bool)(bVar16 ^ 1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit MkTimeResult(const struct tm &prior)
    : local(prior), utcSecs(qMkTime(&local)),
      good(utcSecs != maybeError || meansEnd1969()),
      adjusted(changed(prior))
    {}